

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse_extra.c
# Opt level: O2

int mod2sparse_decomp_osd(mod2sparse *A,int R,mod2sparse *L,mod2sparse *U,int *rows,int *cols)

{
  uint n;
  uint n_00;
  int iVar1;
  int row;
  void *__ptr;
  void *__ptr_00;
  mod2sparse *r;
  ulong uVar2;
  mod2entry *pmVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  char *__ptr_01;
  mod2entry *pmVar7;
  int col;
  size_t sStack_80;
  int local_64;
  
  if (L->n_cols == R) {
    n = A->n_rows;
    if (L->n_rows == n) {
      n_00 = A->n_cols;
      if ((U->n_cols == n_00) && (U->n_rows == R)) {
        if (R <= (int)n_00) {
          __ptr = chk_alloc(n,4);
          __ptr_00 = chk_alloc(n_00,4);
          mod2sparse_clear(L);
          mod2sparse_clear(U);
          r = mod2sparse_allocate(n,n_00);
          mod2sparse_copy(A,r);
          uVar2 = 0;
          uVar4 = 0;
          if (0 < (int)n) {
            uVar4 = (ulong)n;
          }
          for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
            *(int *)((long)__ptr + uVar2 * 4) = (int)uVar2;
            rows[uVar2] = (int)uVar2;
          }
          uVar4 = 0;
          uVar2 = 0;
          if (0 < (int)n_00) {
            uVar2 = (ulong)n_00;
          }
          for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
            *(int *)((long)__ptr_00 + (long)cols[uVar4] * 4) = (int)uVar4;
          }
          uVar4 = 0;
          uVar2 = 0;
          if (0 < R) {
            uVar2 = (ulong)(uint)R;
          }
          local_64 = 0;
          pmVar7 = (mod2entry *)rows;
          do {
            uVar6 = uVar4;
            if (uVar4 == uVar2) {
              for (lVar5 = (long)R; lVar5 < (int)n; lVar5 = lVar5 + 1) {
                while (pmVar7 = L->rows[rows[lVar5]].right, -1 < pmVar7->row) {
                  mod2sparse_delete(L,pmVar7);
                }
              }
              mod2sparse_free(r);
              free(__ptr);
              free(__ptr_00);
              return local_64;
            }
            for (; col = (int)uVar4, uVar6 != n_00; uVar6 = uVar6 + 1) {
              pmVar3 = r->cols;
              pmVar7 = pmVar3 + cols[uVar6];
              while( true ) {
                pmVar7 = pmVar7->down;
                if ((long)pmVar7->row < 0) break;
                if ((long)uVar4 <= (long)*(int *)((long)__ptr + (long)pmVar7->row * 4)) {
                  if (*(int *)((long)__ptr_00 + (long)pmVar7->col * 4) != (int)uVar6) {
                    printf("\n e: %i, k: %i");
                    printf("\nError. Exiting.");
                    goto LAB_0012530b;
                  }
                  cols[uVar6 & 0xffffffff] = cols[uVar4];
                  cols[uVar4] = pmVar7->col;
                  *(int *)((long)__ptr_00 + (long)cols[uVar6 & 0xffffffff] * 4) = (int)uVar6;
                  *(int *)((long)__ptr_00 + (long)cols[uVar4] * 4) = col;
                  iVar1 = *(int *)((long)__ptr + (long)pmVar7->row * 4);
                  lVar5 = (long)iVar1;
                  if (lVar5 < (long)uVar4) {
                    abort();
                  }
                  rows[lVar5] = rows[uVar4];
                  rows[uVar4] = pmVar7->row;
                  *(int *)((long)__ptr + (long)rows[lVar5] * 4) = iVar1;
                  *(int *)((long)__ptr + (long)rows[uVar4] * 4) = col;
                  goto LAB_001251c2;
                }
              }
            }
            local_64 = local_64 + 1;
            pmVar3 = r->cols;
LAB_001251c2:
            pmVar3 = pmVar3[cols[uVar4]].down;
            while( true ) {
              iVar1 = pmVar3->row;
              if ((long)iVar1 < 0) break;
              pmVar3 = pmVar3->down;
              row = *(int *)((long)__ptr + (long)iVar1 * 4);
              if ((long)uVar4 < (long)row) {
                mod2sparse_add_row(r,iVar1,r,pmVar7->row);
                mod2sparse_insert(L,iVar1,col);
              }
              else if ((long)row < (long)uVar4) {
                mod2sparse_insert(U,row,cols[uVar4]);
              }
              else {
                mod2sparse_insert(L,iVar1,col);
                mod2sparse_insert(U,col,cols[uVar4]);
              }
            }
            while (pmVar3 = r->cols[cols[uVar4]].down, -1 < pmVar3->row) {
              mod2sparse_delete(r,pmVar3);
            }
            uVar4 = uVar4 + 1;
          } while( true );
        }
        __ptr_01 = "Trying to abandon more columns than allowed\n";
        sStack_80 = 0x2c;
        goto LAB_0012532b;
      }
    }
  }
  __ptr_01 = "mod2sparse_decomp: Matrices have incompatible dimensions\n";
  sStack_80 = 0x39;
LAB_0012532b:
  fwrite(__ptr_01,sStack_80,1,_stderr);
LAB_0012530b:
  exit(1);
}

Assistant:

int mod2sparse_decomp_osd
        ( mod2sparse *A,	/* Input matrix, M by N */
          int R,		/* Size of sub-matrix to find LU decomposition of */
          mod2sparse *L,	/* Matrix in which L is stored, M by R */
          mod2sparse *U,	/* Matrix in which U is stored, R by N */
          int *rows,		/* Array where row indexes are stored, M long */
          int *cols		/* Array where column indexes are stored, N long */
        )
{

    int abandon_number=0;  	/* Number of columns to abandon at some point *//* When to abandon these columns */
    int abandon_when=0;
    mod2sparse_strategy strategy =Mod2sparse_first;/* Strategy to follow in picking rows/columns */

    int *rinv, *cinv, *acnt, *rcnt;
    mod2sparse *B;
    int M, N;

    mod2entry *e, *f, *fn, *e2;
    int i, j, k, cc, cc2, cc3, cr2, pr;
    int found, nnf;

    M = mod2sparse_rows(A);
    N = mod2sparse_cols(A);

    if (mod2sparse_cols(L)!=R || mod2sparse_rows(L)!=M
        || mod2sparse_cols(U)!=N || mod2sparse_rows(U)!=R)
    { fprintf (stderr,
               "mod2sparse_decomp: Matrices have incompatible dimensions\n");
        exit(1);
    }

    if (abandon_number>N-R)
    { fprintf(stderr,"Trying to abandon more columns than allowed\n");
        exit(1);
    }

    rinv = chk_alloc (M, sizeof *rinv);
    cinv = chk_alloc (N, sizeof *cinv);

    if (abandon_number>0)
    { acnt = chk_alloc (M+1, sizeof *acnt);
    }

    if (strategy==Mod2sparse_minprod)
    { rcnt = chk_alloc (M, sizeof *rcnt);
    }


    //these are the problematic functions!
    mod2sparse_clear(L);
    mod2sparse_clear(U);

    /* Copy A to B.  B will be modified, then discarded. */

    B = mod2sparse_allocate(M,N);
    mod2sparse_copy(A,B);

    /* Count 1s in rows of B, if using minprod strategy. */

    if (strategy==Mod2sparse_minprod)
    { for (i = 0; i<M; i++)
        { rcnt[i] = mod2sparse_count_row(B,i);
        }
    }

    /* Set up initial row and column choices. */

    for (i = 0; i<M; i++) rows[i] = rinv[i] = i;
    for (j = 0; j<N; j++) {

        cinv[cols[j]]=j;

    }
    /* Find L and U one column at a time. */

    nnf = 0;

    for (i = 0; i<R; i++)
    {
        /* Choose the next row and column of B. */

        switch (strategy)
        {
            case Mod2sparse_first:
            {
                found = 0;

                for (k = i; k<N; k++)
                { e = mod2sparse_first_in_col(B,cols[k]);
                    while (!mod2sparse_at_end(e))
                    { if (rinv[mod2sparse_row(e)]>=i)
                        { found = 1;
                            goto out_first;
                        }
                        e = mod2sparse_next_in_col(e);
                    }
                }

                out_first:
                break;
            }

            case Mod2sparse_mincol:
            {
                found = 0;

                for (j = i; j<N; j++)
                { cc2 = mod2sparse_count_col(B,cols[j]);
                    if (!found || cc2<cc)
                    { e2 = mod2sparse_first_in_col(B,cols[j]);
                        while (!mod2sparse_at_end(e2))
                        { if (rinv[mod2sparse_row(e2)]>=i)
                            { found = 1;
                                cc = cc2;
                                e = e2;
                                k = j;
                                break;
                            }
                            e2 = mod2sparse_next_in_col(e2);
                        }
                    }
                }

                break;
            }

            case Mod2sparse_minprod:
            {
                found = 0;

                for (j = i; j<N; j++)
                { cc2 = mod2sparse_count_col(B,cols[j]);
                    e2 = mod2sparse_first_in_col(B,cols[j]);
                    while (!mod2sparse_at_end(e2))
                    { if (rinv[mod2sparse_row(e2)]>=i)
                        { cr2 = rcnt[mod2sparse_row(e2)];
                            if (!found || cc2==1 || (cc2-1)*(cr2-1)<pr)
                            { found = 1;
                                pr = cc2==1 ? 0 : (cc2-1)*(cr2-1);
                                e = e2;
                                k = j;
                            }
                        }
                        e2 = mod2sparse_next_in_col(e2);
                    }
                }

                break;
            }

            default:
            { fprintf(stderr,"mod2sparse_decomp: Unknown stategy\n");
                exit(1);
            }
        }

        if (!found)
        { nnf += 1;
        }



        /* Update 'rows' and 'cols'.  Looks at 'k' and 'e' found above. */

        if (found)
        {
            // if (cinv[mod2sparse_col(e)]!=k) abort();
            if (cinv[mod2sparse_col(e)]!=k){
                printf("\n e: %i, k: %i",mod2sparse_col(e),k);
                printf("\nError. Exiting.");
                exit(1);
            }


            cols[k] = cols[i];
            cols[i] = mod2sparse_col(e);

            cinv[cols[k]] = k;
            cinv[cols[i]] = i;

            k = rinv[mod2sparse_row(e)];

            if (k<i) abort();

            rows[k] = rows[i];
            rows[i] = mod2sparse_row(e);

            rinv[rows[k]] = k;
            rinv[rows[i]] = i;
        }



        /* Update L, U, and B. */

        f = mod2sparse_first_in_col(B,cols[i]);

        while (!mod2sparse_at_end(f))
        {
            fn = mod2sparse_next_in_col(f);
            k = mod2sparse_row(f);
            if (rinv[k]>i)
            { mod2sparse_add_row(B,k,B,mod2sparse_row(e));
                if (strategy==Mod2sparse_minprod)
                { rcnt[k] = mod2sparse_count_row(B,k);
                }
                mod2sparse_insert(L,k,i);
            }
            else if (rinv[k]<i)
            { mod2sparse_insert(U,rinv[k],cols[i]);
            }
            else
            { mod2sparse_insert(L,k,i);
                mod2sparse_insert(U,i,cols[i]);
            }

            f = fn;
        }


        /* Get rid of all entries in the current column of B, just to save space. */

        for (;;)
        { f = mod2sparse_first_in_col(B,cols[i]);
            if (mod2sparse_at_end(f)) break;
            mod2sparse_delete(B,f);
        }

        /* Abandon columns of B with lots of entries if it's time for that. */

        if (abandon_number>0 && i==abandon_when)
        {
            for (k = 0; k<M+1; k++)
            { acnt[k] = 0;
            }
            for (j = 0; j<N; j++)
            { k = mod2sparse_count_col(B,j);
                acnt[k] += 1;
            }

            cc = abandon_number;
            k = M;
            while (acnt[k]<cc)
            { cc -= acnt[k];
                k -= 1;
                if (k<0) abort();
            }

            cc2 = 0;
            for (j = 0; j<N; j++)
            { cc3 = mod2sparse_count_col(B,j);
                if (cc3>k || cc3==k && cc>0)
                { if (cc3==k) cc -= 1;
                    for (;;)
                    { f = mod2sparse_first_in_col(B,j);
                        if (mod2sparse_at_end(f)) break;
                        mod2sparse_delete(B,f);
                    }
                    cc2 += 1;
                }
            }

            if (cc2!=abandon_number) abort();

            if (strategy==Mod2sparse_minprod)
            { for (j = 0; j<M; j++)
                { rcnt[j] = mod2sparse_count_row(B,j);
                }
            }
        }
    }

    /* Get rid of all entries in the rows of L past row R, after reordering. */

    for (i = R; i<M; i++)
    { for (;;)
        { f = mod2sparse_first_in_row(L,rows[i]);
            if (mod2sparse_at_end(f)) break;
            mod2sparse_delete(L,f);
        }
    }

    mod2sparse_free(B);
    free(rinv);
    free(cinv);
    if (strategy==Mod2sparse_minprod) free(rcnt);
    if (abandon_number>0) free(acnt);

    return nnf;
}